

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O2

MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
* wasm::WATParser::anon_unknown_21::assertion
            (MaybeResult<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>_>
             *__return_storage_ptr__,Lexer *in)

{
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *this;
  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *this_00;
  string *psVar1;
  size_t pos;
  bool bVar2;
  BasicHeapType BVar3;
  optional<float> oVar4;
  undefined1 *puVar5;
  _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
  *__args;
  _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction> *__rhs;
  _Variadic_union<std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
  *__x;
  _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *p_Var6;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  *p_Var7;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
  *__rhs_00;
  _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *p_Var8;
  _Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *p_Var9;
  MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *__rhs_01;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  *__rhs_02;
  _Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
  *p_Var10;
  string *psVar11;
  undefined4 uVar12;
  int iVar13;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  string_view expected_02;
  string_view expected_03;
  string_view expected_04;
  string_view expected_05;
  string_view expected_06;
  string_view expected_07;
  string_view expected_08;
  string_view expected_09;
  string_view expected_10;
  string_view expected_11;
  string_view expected_12;
  string_view expected_13;
  string_view expected_14;
  string_view expected_15;
  string_view expected_16;
  string_view expected_17;
  optional<double> oVar14;
  string local_368;
  _Variadic_union<std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
  local_348;
  char local_328;
  undefined1 auStack_318 [8];
  ExpectedResults res;
  MaybeResult<wasm::WATParser::AssertReturn> a;
  undefined1 auStack_268 [8];
  LaneResults lanes;
  undefined1 local_248 [8];
  Result<wasm::Literal> c;
  undefined1 local_1d8 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> a_1;
  undefined1 local_148 [8];
  Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> _val;
  undefined1 local_c8;
  __index_type local_c0;
  undefined1 local_b8 [8];
  Result<wasm::WATParser::NaNKind> kind;
  Result<wasm::WATParser::NaNKind> _val_1;
  char local_48;
  
  expected._M_str = "assert_return";
  expected._M_len = 0xd;
  bVar2 = Lexer::takeSExprStart(in,expected);
  if (bVar2) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           local_1d8,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_148,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1d8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      std::__cxx11::string::string((string *)local_248,(string *)local_148);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err> *)
                 &stack0xfffffffffffffd08,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_148);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_148);
      auStack_318 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      this_00 = (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
      while (bVar2 = Lexer::peekRParen(in), !bVar2) {
        Lexer::Lexer((Lexer *)local_148,in);
        const_((Result<wasm::Literal> *)local_248,(Lexer *)local_148);
        if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
            super__Move_assign_alias<wasm::Literal,_wasm::Err>.
            super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
            super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
            super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\x01') {
          expected_00._M_str = "f32.const";
          expected_00._M_len = 9;
          bVar2 = Lexer::takeSExprStart(in,expected_00);
          if (bVar2) {
            nan((anon_unknown_21 *)local_b8,(char *)in);
            std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this_00,
                            (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b8)
            ;
            if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ ==
                '\x01') {
              psVar11 = (string *)
                        ((long)&a_1.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        + 0x68);
              std::__cxx11::string::string(psVar11,(string *)this_00);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
              ::_Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                          *)((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                            0x20),psVar11);
LAB_00c83759:
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&a_1.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68));
              std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>
              ::~_Variant_storage(this_00);
            }
            else {
              std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>
              ::~_Variant_storage(this_00);
              bVar2 = Lexer::takeRParen(in);
              if (bVar2) {
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                     local_b8._0_4_;
LAB_00c838fa:
                local_48 = '\0';
              }
              else {
                psVar1 = (string *)
                         ((long)&a_1.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)psVar1,"expected end of f32.const",
                           (allocator<char> *)auStack_268);
                Lexer::err((Err *)this_00,in,psVar1);
                std::__detail::__variant::
                _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                ::_Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                            *)((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                              0x20),this_00);
LAB_00c83aca:
                std::__cxx11::string::~string((string *)this_00);
                std::__cxx11::string::~string
                          ((string *)
                           ((long)&a_1.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
              }
            }
            std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                              local_b8);
          }
          else {
            expected_01._M_str = "f64.const";
            expected_01._M_len = 9;
            bVar2 = Lexer::takeSExprStart(in,expected_01);
            if (bVar2) {
              nan((anon_unknown_21 *)local_b8,(char *)in);
              std::__detail::__variant::_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                this_00,(_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>
                                         *)local_b8);
              if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ !=
                  '\x01') {
                std::__detail::__variant::
                _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                          (this_00);
                bVar2 = Lexer::takeRParen(in);
                if (!bVar2) {
                  psVar1 = (string *)
                           ((long)&a_1.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)psVar1,"expected end of f64.const",
                             (allocator<char> *)auStack_268);
                  Lexer::err((Err *)this_00,in,psVar1);
                  std::__detail::__variant::
                  _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                  ::_Variant_storage<1ul,wasm::Err>
                            ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                              *)((long)&_val_1.val.
                                        super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                + 0x20),this_00);
                  goto LAB_00c83aca;
                }
                _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                     local_b8._0_4_;
                goto LAB_00c838fa;
              }
              psVar11 = (string *)
                        ((long)&a_1.val.
                                super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                .
                                super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                        + 0x68);
              std::__cxx11::string::string(psVar11,(string *)this_00);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
              ::_Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                          *)((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                            0x20),psVar11);
              goto LAB_00c83759;
            }
            expected_02._M_str = "v128.const";
            expected_02._M_len = 10;
            bVar2 = Lexer::takeSExprStart(in,expected_02);
            if (!bVar2) {
              expected_04._M_str = "ref.extern";
              expected_04._M_len = 10;
              bVar2 = Lexer::takeSExprStart(in,expected_04);
              if (bVar2) {
                bVar2 = Lexer::takeRParen(in);
                if (bVar2) {
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index = '\b';
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
LAB_00c83e32:
                  local_48 = '\0';
                  goto LAB_00c83ae6;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)this_00,"expected end of ref.extern",
                           (allocator<char> *)
                           ((long)&a_1.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
                Lexer::err((Err *)local_b8,in,(string *)this_00);
                std::__detail::__variant::
                _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                ::_Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                            *)((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                              0x20),(_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                    local_b8);
              }
              else {
                expected_06._M_str = "ref.func";
                expected_06._M_len = 8;
                bVar2 = Lexer::takeSExprStart(in,expected_06);
                if (bVar2) {
                  bVar2 = Lexer::takeRParen(in);
                  if (bVar2) {
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                         '\x10';
                    _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                    super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                    goto LAB_00c83e32;
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)this_00,"expected end of ref.func",
                             (allocator<char> *)
                             ((long)&a_1.val.
                                     super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     .
                                     super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                             + 0x68));
                  Lexer::err((Err *)local_b8,in,(string *)this_00);
                  std::__detail::__variant::
                  _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                  ::_Variant_storage<1ul,wasm::Err>
                            ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                              *)((long)&_val_1.val.
                                        super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .
                                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        .super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                + 0x20),
                             (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             local_b8);
                }
                else {
                  expected_07._M_str = "ref.struct";
                  expected_07._M_len = 10;
                  bVar2 = Lexer::takeSExprStart(in,expected_07);
                  if (bVar2) {
                    bVar2 = Lexer::takeRParen(in);
                    if (bVar2) {
                      _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                           '8';
                      _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0;
                      goto LAB_00c83e32;
                    }
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)this_00,"expected end of ref.struct",
                               (allocator<char> *)
                               ((long)&a_1.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
                    Lexer::err((Err *)local_b8,in,(string *)this_00);
                    std::__detail::__variant::
                    _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                    ::_Variant_storage<1ul,wasm::Err>
                              ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                *)((long)&_val_1.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                  + 0x20),
                               (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_b8);
                  }
                  else {
                    expected_08._M_str = "ref.array";
                    expected_08._M_len = 9;
                    bVar2 = Lexer::takeSExprStart(in,expected_08);
                    if (bVar2) {
                      bVar2 = Lexer::takeRParen(in);
                      if (bVar2) {
                        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index =
                             '@';
                        _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ = 0
                        ;
                        goto LAB_00c83e32;
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)this_00,"expected end of ref.array",
                                 (allocator<char> *)
                                 ((long)&a_1.val.
                                         super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 + 0x68));
                      Lexer::err((Err *)local_b8,in,(string *)this_00);
                      std::__detail::__variant::
                      _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                      ::_Variant_storage<1ul,wasm::Err>
                                ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                  *)((long)&_val_1.val.
                                            super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                    + 0x20),
                                 (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                 local_b8);
                    }
                    else {
                      expected_09._M_str = "ref.eq";
                      expected_09._M_len = 6;
                      bVar2 = Lexer::takeSExprStart(in,expected_09);
                      if (bVar2) {
                        bVar2 = Lexer::takeRParen(in);
                        if (bVar2) {
                          _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_index
                               = '(';
                          _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_ =
                               0;
                          goto LAB_00c83e32;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)this_00,"expected end of ref.eq",
                                   (allocator<char> *)
                                   ((long)&a_1.val.
                                           super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                           .
                                           super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   + 0x68));
                        Lexer::err((Err *)local_b8,in,(string *)this_00);
                        std::__detail::__variant::
                        _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                        ::_Variant_storage<1ul,wasm::Err>
                                  ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                    *)((long)&_val_1.val.
                                              super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                      + 0x20),
                                   (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                   local_b8);
                      }
                      else {
                        expected_10._M_str = "ref.i31";
                        expected_10._M_len = 7;
                        bVar2 = Lexer::takeSExprStart(in,expected_10);
                        if (bVar2) {
                          bVar2 = Lexer::takeRParen(in);
                          if (bVar2) {
                            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            _M_index = '0';
                            _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._33_7_
                                 = 0;
                            goto LAB_00c83e32;
                          }
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)this_00,"expected end of ref.i31",
                                     (allocator<char> *)
                                     ((long)&a_1.val.
                                             super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                             .
                                             super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                             .
                                             super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                             .
                                             super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                             .
                                             super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                     + 0x68));
                          Lexer::err((Err *)local_b8,in,(string *)this_00);
                          std::__detail::__variant::
                          _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                          ::_Variant_storage<1ul,wasm::Err>
                                    ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                      *)((long)&_val_1.val.
                                                super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                .
                                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                        + 0x20),
                                     (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *
                                     )local_b8);
                        }
                        else {
                          expected_11._M_str = "ref.i31_shared";
                          expected_11._M_len = 0xe;
                          bVar2 = Lexer::takeSExprStart(in,expected_11);
                          if (bVar2) {
                            bVar2 = Lexer::takeRParen(in);
                            if (bVar2) {
                              BVar3 = HeapType::getBasic((HeapType *)&HeapTypes::i31,Shared);
                              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                              _32_8_ = ZEXT48(BVar3);
                              goto LAB_00c83e32;
                            }
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)this_00,"expected end of ref.i31_shared",
                                       (allocator<char> *)
                                       ((long)&a_1.val.
                                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       + 0x68));
                            Lexer::err((Err *)local_b8,in,(string *)this_00);
                            std::__detail::__variant::
                            _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                            ::_Variant_storage<1ul,wasm::Err>
                                      ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                        *)((long)&_val_1.val.
                                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          + 0x20),
                                       (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>
                                        *)local_b8);
                          }
                          else {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)this_00,"unrecognized result",
                                       (allocator<char> *)
                                       ((long)&a_1.val.
                                               super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                               .
                                               super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       + 0x68));
                            Lexer::err((Err *)local_b8,in,(string *)this_00);
                            std::__detail::__variant::
                            _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                            ::_Variant_storage<1ul,wasm::Err>
                                      ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                        *)((long)&_val_1.val.
                                                  super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                                  .
                                                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          + 0x20),
                                       (_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>
                                        *)local_b8);
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__cxx11::string::~string((string *)local_b8);
              std::__cxx11::string::~string((string *)this_00);
              goto LAB_00c83ae6;
            }
            auStack_268 = (undefined1  [8])0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            lanes.
            super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            expected_03._M_str = "f32x4";
            expected_03._M_len = 5;
            bVar2 = Lexer::takeKeyword(in,expected_03);
            if (bVar2) {
              iVar13 = 4;
              while (bVar2 = iVar13 != 0, iVar13 = iVar13 + -1, bVar2) {
                oVar4 = Lexer::takeF32(in);
                if (((ulong)oVar4.super__Optional_base<float,_true,_true>._M_payload.
                            super__Optional_payload_base<float> >> 0x20 & 1) == 0) {
                  nan((anon_unknown_21 *)local_b8,(char *)in);
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                            ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)this_00,
                             (_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b8
                            );
                  if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                      super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_
                      == '\x01') {
                    psVar11 = (string *)
                              ((long)&a_1.val.
                                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              + 0x68);
                    std::__cxx11::string::string(psVar11,(string *)this_00);
                    std::__detail::__variant::
                    _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                    ::_Variant_storage<1ul,wasm::Err>
                              ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                *)((long)&_val_1.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                  + 0x20),psVar11);
                    goto LAB_00c83cd1;
                  }
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            (this_00);
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                       local_b8._0_4_;
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 4;
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ = 1;
                  std::
                  vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                  ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                            ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                              *)auStack_268,
                             (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)this_00);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                  ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)this_00);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                            ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                             local_b8);
                }
                else {
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ =
                       oVar4.super__Optional_base<float,_true,_true>._M_payload.
                       super__Optional_payload_base<float>._M_payload;
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 4;
                  std::__detail::__variant::
                  _Variant_storage<false,wasm::Literal,wasm::WATParser::NaNResult>::
                  _Variant_storage<0ul,wasm::Literal>
                            ((_Variant_storage<false,wasm::Literal,wasm::WATParser::NaNResult> *)
                             local_b8,this_00);
                  std::
                  vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                  ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                            ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                              *)auStack_268,
                             (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_b8);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                  ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)local_b8);
                  Literal::~Literal((Literal *)this_00);
                }
              }
LAB_00c83a17:
              bVar2 = Lexer::takeRParen(in);
              if (!bVar2) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)this_00,"expected end of v128.const",
                           (allocator<char> *)
                           ((long)&a_1.val.
                                   super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                   .
                                   super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           + 0x68));
                Lexer::err((Err *)local_b8,in,(string *)this_00);
                std::__detail::__variant::
                _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                ::_Variant_storage<1ul,wasm::Err>
                          ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                            *)((long)&_val_1.val.
                                      super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                              0x20),(_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                    local_b8);
                goto LAB_00c83bdc;
              }
              _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
              super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ = auStack_268
              ;
              lanes.
              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              auStack_268 = (undefined1  [8])0x0;
              lanes.
              super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_48 = '\0';
            }
            else {
              expected_05._M_str = "f64x2";
              expected_05._M_len = 5;
              bVar2 = Lexer::takeKeyword(in,expected_05);
              if (bVar2) {
                iVar13 = 2;
LAB_00c83961:
                while (bVar2 = iVar13 != 0, iVar13 = iVar13 + -1, bVar2) {
                  oVar14 = Lexer::takeF64(in);
                  if (((undefined1  [16])
                       oVar14.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double> & (undefined1  [16])0x1) ==
                      (undefined1  [16])0x0) {
                    nan((anon_unknown_21 *)local_b8,(char *)in);
                    std::__detail::__variant::
                    _Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>::_Copy_ctor_base
                              ((_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               this_00,(_Copy_ctor_base<false,_wasm::WATParser::NaNKind,_wasm::Err>
                                        *)local_b8);
                    if (_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u.
                        _24_1_ != '\x01') goto code_r0x00c839d3;
                    psVar11 = (string *)
                              ((long)&a_1.val.
                                      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                      .
                                      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              + 0x68);
                    std::__cxx11::string::string(psVar11,(string *)this_00);
                    std::__detail::__variant::
                    _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                    ::_Variant_storage<1ul,wasm::Err>
                              ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                                *)((long)&_val_1.val.
                                          super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                  + 0x20),psVar11);
LAB_00c83cd1:
                    std::__cxx11::string::~string
                              ((string *)
                               ((long)&a_1.val.
                                       super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                       .
                                       super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                               + 0x68));
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              (this_00);
                    std::__detail::__variant::
                    _Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::~_Variant_storage
                              ((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                               local_b8);
                    goto LAB_00c83ce9;
                  }
                  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_8_ =
                       oVar14.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
                  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._8_8_ = 5;
                  std::__detail::__variant::
                  _Variant_storage<false,wasm::Literal,wasm::WATParser::NaNResult>::
                  _Variant_storage<0ul,wasm::Literal>
                            ((_Variant_storage<false,wasm::Literal,wasm::WATParser::NaNResult> *)
                             local_b8,this_00);
                  std::
                  vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                  ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
                            ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
                              *)auStack_268,
                             (variant<wasm::Literal,_wasm::WATParser::NaNResult> *)local_b8);
                  std::__detail::__variant::
                  _Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
                  ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>
                                     *)local_b8);
                  Literal::~Literal((Literal *)this_00);
                }
                goto LAB_00c83a17;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)this_00,"unexpected vector shape",
                         (allocator<char> *)
                         ((long)&a_1.val.
                                 super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                                 .
                                 super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         + 0x68));
              Lexer::err((Err *)local_b8,in,(string *)this_00);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
              ::_Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                          *)((long)&_val_1.val.
                                    super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                            0x20),(_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)
                                  local_b8);
LAB_00c83bdc:
              std::__cxx11::string::~string((string *)local_b8);
              std::__cxx11::string::~string((string *)this_00);
            }
LAB_00c83ce9:
            std::
            vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
            ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>
                       *)auStack_268);
          }
        }
        else {
          Lexer::operator=(in,(Lexer *)local_148);
          puVar5 = (undefined1 *)0x0;
          if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
              super__Move_assign_alias<wasm::Literal,_wasm::Err>.
              super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
              super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
              super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
            puVar5 = local_248;
          }
          std::__detail::__variant::
          _Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
          ::_Variant_storage<0ul,wasm::Literal&>
                    ((_Variant_storage<false,std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,wasm::Err>
                      *)((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20),
                     puVar5);
        }
LAB_00c83ae6:
        std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::Err> *)local_248);
        Lexer::~Lexer((Lexer *)local_148);
        std::__detail::__variant::
        _Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)local_148,
                          (_Copy_ctor_base<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                           *)((long)&_val_1.val.
                                     super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> +
                             0x20));
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
          std::__cxx11::string::string((string *)local_248,(string *)local_148);
          std::__detail::__variant::
          _Variant_storage<false,std::vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>,wasm::Err>
          ::_Variant_storage<1ul,wasm::Err>
                    ((_Variant_storage<false,std::vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>,wasm::Err>
                      *)&local_348,local_248);
          std::__cxx11::string::~string((string *)local_248);
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)local_148);
          std::__detail::__variant::
          _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
          ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                               *)((long)&_val_1.val.
                                         super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>
                                 + 0x20));
          goto LAB_00c83f66;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                             *)local_148);
        this = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                *)((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
        __args = (_Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
                  *)0x0;
        if (local_48 == '\0') {
          __args = this;
        }
        std::
        vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
        ::
        emplace_back<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>
                  ((vector<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::RefResult,wasm::WATParser::NaNResult,std::vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>>>>
                    *)auStack_318,
                   (variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>
                    *)__args);
        std::__detail::__variant::
        _Variant_storage<false,_std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_wasm::Err>
        ::~_Variant_storage(this);
      }
      local_348._0_8_ = auStack_318;
      local_348._8_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_348._16_8_ =
           res.
           super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      auStack_318 = (undefined1  [8])0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      res.
      super__Vector_base<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328 = '\0';
LAB_00c83f66:
      std::
      vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
      ::~vector((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                 *)auStack_318);
      std::__detail::__variant::
      _Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::_Copy_ctor_base((_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)local_148,
                        (_Copy_ctor_base<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                         *)&local_348._M_first);
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
        std::__cxx11::string::string((string *)local_248,(string *)local_148);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err> *)
                   &stack0xfffffffffffffd08,local_248);
        std::__cxx11::string::~string((string *)local_248);
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)local_148);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                             *)local_148);
        bVar2 = Lexer::takeRParen(in);
        if (bVar2) {
          __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                   *)0x0;
          if (a_1.val.
              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
              ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
            __rhs = (_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                     *)local_1d8;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
          _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)local_148,__rhs);
          __x = (_Variadic_union<std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                 *)0x0;
          if (local_328 == '\0') {
            __x = &local_348;
          }
          std::
          vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
          ::vector((vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                    *)((long)&_val.val.
                              super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                              .
                              super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                      + 0x60),
                   (vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>
                    *)&__x->_M_first);
          std::__detail::__variant::
          _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err>::
          _Variant_storage<0ul,wasm::WATParser::AssertReturn>
                    ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err> *)
                     &stack0xfffffffffffffd08,local_148);
          AssertReturn::~AssertReturn((AssertReturn *)local_148);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_368,"expected end of assert_return",
                     (allocator<char> *)local_248);
          Lexer::err((Err *)local_148,in,&local_368);
          std::__detail::__variant::
          _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::None,wasm::Err> *)
                     &stack0xfffffffffffffd08,local_148);
          std::__cxx11::string::~string((string *)local_148);
          std::__cxx11::string::~string((string *)&local_368);
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::RefResult,_wasm::WATParser::NaNResult,_std::vector<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>,_std::allocator<std::variant<wasm::Literal,_wasm::WATParser::NaNResult>_>_>_>_>_>,_wasm::Err>
                           *)&local_348._M_first);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)local_1d8);
    if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
        _M_first._M_storage._M_storage[0x78] != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                 local_148,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                 &stack0xfffffffffffffd08);
      if (local_c8 == '\x02') {
        std::__cxx11::string::string((string *)local_1d8,(string *)local_148);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                           *)local_148);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                           *)local_148);
        p_Var6 = (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)0x0
        ;
        if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
            _M_first._M_storage._M_storage[0x78] == '\0') {
          p_Var6 = (_Copy_ctor_base<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
                   &stack0xfffffffffffffd08;
        }
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
        ::_Variant_storage<0ul,wasm::WATParser::AssertReturn&>
                  ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                    *)local_148,p_Var6);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::
        _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,local_148);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)local_148);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
      return __return_storage_ptr__;
    }
  }
  else {
    a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u._M_first
    ._M_storage._M_storage[0x78] = '\x01';
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err> *)
             &stack0xfffffffffffffd08);
  expected_12._M_str = "assert_exception";
  expected_12._M_len = 0x10;
  bVar2 = Lexer::takeSExprStart(in,expected_12);
  if (bVar2) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           &stack0xfffffffffffffd08,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1d8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)&stack0xfffffffffffffd08);
    if (a_1.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      std::__cxx11::string::string((string *)local_248,(string *)local_1d8);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                 local_148,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1d8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1d8);
      bVar2 = Lexer::takeRParen(in);
      if (bVar2) {
        local_1d8._0_4_ = 2;
        p_Var7 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  *)0x0;
        if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
            _M_first._M_storage._M_storage[0x60] == '\0') {
          p_Var7 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    *)&stack0xfffffffffffffd08;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a_1,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                 *)p_Var7);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
        _Variant_storage<0ul,wasm::WATParser::AssertAction>
                  ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a_1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"expected end of assert_exception",
                   (allocator<char> *)local_248);
        Lexer::err((Err *)local_1d8,in,(string *)local_b8);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__cxx11::string::~string((string *)local_b8);
      }
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index == '\x01') goto LAB_00c842ee;
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               &stack0xfffffffffffffd08,
               (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_148);
    if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
        _M_first._M_storage._M_storage[0x68] != '\x02') {
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
      p_Var8 = (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)0x0;
      if (_val.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_index == '\0') {
        p_Var8 = (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                 local_148;
      }
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
      ::_Variant_storage<1ul,wasm::WATParser::AssertAction&>
                ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                  *)&stack0xfffffffffffffd08,p_Var8);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::
      _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,&stack0xfffffffffffffd08);
LAB_00c847a3:
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)&stack0xfffffffffffffd08);
      goto LAB_00c847af;
    }
    std::__cxx11::string::string((string *)local_1d8,(string *)&stack0xfffffffffffffd08);
    std::__detail::__variant::
    _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
    ::_Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                *)__return_storage_ptr__,local_1d8);
LAB_00c846d8:
    std::__cxx11::string::~string((string *)local_1d8);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               &stack0xfffffffffffffd08);
LAB_00c847af:
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
               local_148);
    return __return_storage_ptr__;
  }
  _val.val.
  super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  .
  super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
  ._M_index = '\x01';
LAB_00c842ee:
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
             local_148);
  expected_13._M_str = "assert_exhaustion";
  expected_13._M_len = 0x11;
  bVar2 = Lexer::takeSExprStart(in,expected_13);
  if (bVar2) {
    action((Result<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_> *)
           &stack0xfffffffffffffd08,in);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)local_1d8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                       *)&stack0xfffffffffffffd08);
    if (a_1.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x01') {
      std::__cxx11::string::string((string *)local_248,(string *)local_1d8);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                 local_148,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1d8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                           *)local_1d8);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"expected error message",
                   (allocator<char> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_1d8,in,(string *)local_b8);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        psVar11 = (string *)local_b8;
LAB_00c84536:
        std::__cxx11::string::~string(psVar11);
      }
      else {
        bVar2 = Lexer::takeRParen(in);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20),
                     "expected end of assertion",
                     (allocator<char> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_1d8,in,
                     (string *)
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
          std::__detail::__variant::
          _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                     local_148,local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          psVar11 = (string *)
                    ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
          goto LAB_00c84536;
        }
        local_1d8._0_4_ = 1;
        p_Var7 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                  *)0x0;
        if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
            _M_first._M_storage._M_storage[0x60] == '\0') {
          p_Var7 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                    *)&stack0xfffffffffffffd08;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&a_1,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                                 *)p_Var7);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err>::
        _Variant_storage<0ul,wasm::WATParser::AssertAction>
                  ((_Variant_storage<false,wasm::WATParser::AssertAction,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&a_1);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_index != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                 &stack0xfffffffffffffd08,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                 local_148);
      if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
          _M_first._M_storage._M_storage[0x68] != '\x02') {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>
                           *)&stack0xfffffffffffffd08);
        p_Var8 = (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)0x0
        ;
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_index == '\0') {
          p_Var8 = (_Copy_ctor_base<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
                   local_148;
        }
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
        ::_Variant_storage<1ul,wasm::WATParser::AssertAction&>
                  ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                    *)&stack0xfffffffffffffd08,p_Var8);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::
        _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,&stack0xfffffffffffffd08);
        goto LAB_00c847a3;
      }
      std::__cxx11::string::string((string *)local_1d8,(string *)&stack0xfffffffffffffd08);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,local_1d8);
      goto LAB_00c846d8;
    }
  }
  else {
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_index = '\x01';
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertAction,_wasm::None,_wasm::Err> *)
             local_148);
  expected_14._M_str = "assert_malformed";
  expected_14._M_len = 0x10;
  bVar2 = Lexer::takeSExprStart(in,expected_14);
  if (bVar2) {
    uVar12 = 1;
LAB_00c84584:
    bVar2 = false;
LAB_00c845aa:
    wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
                *)&stack0xfffffffffffffd08,in,bVar2);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1d8,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)&stack0xfffffffffffffd08);
    if (a_1.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
      std::__cxx11::string::string((string *)local_248,(string *)local_1d8);
      std::__detail::__variant::
      _Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err> *)
                 local_148,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1d8);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                           *)local_1d8);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248,in);
      if (c.val.super__Variant_base<wasm::Literal,_wasm::Err>.
          super__Move_assign_alias<wasm::Literal,_wasm::Err>.
          super__Copy_assign_alias<wasm::Literal,_wasm::Err>.
          super__Move_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Literal,_wasm::Err>.
          super__Variant_storage_alias<wasm::Literal,_wasm::Err>._M_u._24_1_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"expected error message",
                   (allocator<char> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_1d8,in,(string *)local_b8);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        psVar11 = (string *)local_b8;
LAB_00c8481c:
        std::__cxx11::string::~string(psVar11);
      }
      else {
        bVar2 = Lexer::takeRParen(in);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20),
                     "expected end of assertion",
                     (allocator<char> *)
                     ((long)&_val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_1d8,in,
                     (string *)
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
          std::__detail::__variant::
          _Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err> *)
                     local_148,local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          psVar11 = (string *)
                    ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20);
          goto LAB_00c8481c;
        }
        __rhs_00 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                    *)0x0;
        if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
            _M_first._M_storage._M_storage[0x28] == '\0') {
          __rhs_00 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                      *)&stack0xfffffffffffffd08;
        }
        local_1d8._0_4_ = uVar12;
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&a_1,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                                 *)__rhs_00);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err>::
        _Variant_storage<0ul,wasm::WATParser::AssertModule>
                  ((_Variant_storage<false,wasm::WATParser::AssertModule,wasm::None,wasm::Err> *)
                   local_148,local_1d8);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                           *)&a_1);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x30] != '\x01') {
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
                 &stack0xfffffffffffffd08,
                 (_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
                 local_148);
      if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_u.
          _M_first._M_storage._M_storage[0x30] == '\x02') {
        std::__cxx11::string::string((string *)local_1d8,(string *)&stack0xfffffffffffffd08);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,local_1d8);
        std::__cxx11::string::~string((string *)local_1d8);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           *)&stack0xfffffffffffffd08);
      }
      else {
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                           *)&stack0xfffffffffffffd08);
        p_Var9 = (_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)0x0
        ;
        if (_val.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x30] == '\0') {
          p_Var9 = (_Copy_ctor_base<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
                   local_148;
        }
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
        ::_Variant_storage<2ul,wasm::WATParser::AssertModule&>
                  ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                    *)&stack0xfffffffffffffd08,p_Var9);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::
        _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)__return_storage_ptr__,&stack0xfffffffffffffd08);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)&stack0xfffffffffffffd08);
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>
                         *)local_148);
      return __return_storage_ptr__;
    }
  }
  else {
    expected_15._M_str = "assert_invalid";
    expected_15._M_len = 0xe;
    bVar2 = Lexer::takeSExprStart(in,expected_15);
    if (bVar2) {
      uVar12 = 2;
      bVar2 = true;
      goto LAB_00c845aa;
    }
    expected_16._M_str = "assert_unlinkable";
    expected_16._M_len = 0x11;
    bVar2 = Lexer::takeSExprStart(in,expected_16);
    if (bVar2) {
      uVar12 = 3;
      goto LAB_00c84584;
    }
    _val.val.
    super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    .
    super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
    ._M_u._M_first._M_storage._M_storage[0x30] = '\x01';
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::WATParser::AssertModule,_wasm::None,_wasm::Err> *)
             local_148);
  expected_17._M_str = "assert_trap";
  expected_17._M_len = 0xb;
  bVar2 = Lexer::takeSExprStart(in,expected_17);
  if (!bVar2) {
    a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_index =
         '\x01';
    goto LAB_00c84cce;
  }
  pos = in->pos;
  maybeAction((MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
               *)local_1d8,in);
  if (a_1.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x60] != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_148,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1d8);
    if (_val.val.
        super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        .
        super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
        ._M_u._M_first._M_storage._M_storage[0x60] == '\x02') {
      std::__cxx11::string::string((string *)local_248,(string *)local_148);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)&stack0xfffffffffffffd08,local_248);
      std::__cxx11::string::~string((string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_148);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                           *)local_148);
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8,in);
      if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_248,"expected error message",
                   (allocator<char> *)
                   ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_148,in,(string *)local_248);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)&stack0xfffffffffffffd08,local_148);
LAB_00c84c9e:
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)local_248);
      }
      else {
        bVar2 = Lexer::takeRParen(in);
        if (!bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_248,"expected end of assertion",
                     (allocator<char> *)
                     ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_148,in,(string *)local_248);
          std::__detail::__variant::
          _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
          ::_Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                      *)&stack0xfffffffffffffd08,local_148);
          goto LAB_00c84c9e;
        }
        local_248._0_4_ = 0;
        __rhs_02 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                    *)0x0;
        if (a_1.val.
            super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            .
            super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x60] == '\0') {
          __rhs_02 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                      *)local_1d8;
        }
        std::__detail::__variant::
        _Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                         *)&c,(_Copy_ctor_base<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                               *)__rhs_02);
        std::__detail::__variant::
        _Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
        ::_Variant_storage<1ul,wasm::WATParser::AssertAction>
                  ((_Variant_storage<false,wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                    *)local_148,local_248);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::
        _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)&stack0xfffffffffffffd08,local_148);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
        ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                             *)local_148);
        std::__detail::__variant::
        _Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>::
        ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>
                           *)&c);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_b8);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                         *)local_1d8);
    goto LAB_00c84cce;
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::None,_wasm::Err>
                       *)local_1d8);
  wastModule((Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
             )local_1d8,in,false);
  if (a_1.val.
      super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      .
      super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
      ._M_u._M_first._M_storage._M_storage[0x28] == '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,"expected action or module",(allocator<char> *)local_b8);
    Lexer::err((Err *)local_148,in,pos,(string *)local_248);
    std::__detail::__variant::
    _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
    ::_Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                *)&stack0xfffffffffffffd08,local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)local_248);
  }
  else {
    Lexer::takeString_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,in);
    if (kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._24_1_ == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_248,"expected error message",
                 (allocator<char> *)
                 ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
      Lexer::err((Err *)local_148,in,(string *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)&stack0xfffffffffffffd08,local_148);
LAB_00c84c29:
      std::__cxx11::string::~string((string *)local_148);
      std::__cxx11::string::~string((string *)local_248);
    }
    else {
      bVar2 = Lexer::takeRParen(in);
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_248,"expected end of assertion",
                   (allocator<char> *)
                   ((long)&kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err> + 0x20));
        Lexer::err((Err *)local_148,in,(string *)local_248);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
        ::_Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                    *)&stack0xfffffffffffffd08,local_148);
        goto LAB_00c84c29;
      }
      local_248._0_4_ = 0;
      __rhs_01 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                  *)0x0;
      if (a_1.val.
          super__Variant_base<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_assign_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Move_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          .
          super__Variant_storage_alias<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[0x28] == '\0') {
        __rhs_01 = (MaybeResult<std::variant<wasm::WATParser::InvokeAction,_wasm::WATParser::GetAction>_>
                    *)local_1d8;
      }
      std::__detail::__variant::
      _Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                       *)&c,(_Copy_ctor_base<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                             *)__rhs_01);
      std::
      variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
      ::variant<wasm::WATParser::AssertModule,void,void,wasm::WATParser::AssertModule,void>
                ((variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                  *)local_148,(AssertModule *)local_248);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::
      _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)&stack0xfffffffffffffd08,
                 (variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>
                  *)local_148);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
      ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>
                           *)local_148);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>
                         *)&c);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
  ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                       *)local_1d8);
LAB_00c84cce:
  if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>._M_index ==
      '\x01') {
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
     + 0x88) = '\x01';
  }
  else {
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)local_148,
                      (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                       *)&stack0xfffffffffffffd08);
    if (local_c0 == '\x02') {
      std::__cxx11::string::string((string *)local_1d8,(string *)local_148);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::_Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,local_1d8);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)local_148);
    }
    else {
      std::__detail::__variant::
      _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                           *)local_148);
      p_Var10 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                 *)0x0;
      if (a.val.super__Variant_base<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::AssertReturn,_wasm::None,_wasm::Err>.
          _M_index == '\0') {
        p_Var10 = (_Copy_ctor_base<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                   *)&stack0xfffffffffffffd08;
      }
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
      ::
      _Variant_storage<0ul,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>&>
                ((_Variant_storage<false,std::variant<wasm::WATParser::AssertReturn,wasm::WATParser::AssertAction,wasm::WATParser::AssertModule>,wasm::None,wasm::Err>
                  *)__return_storage_ptr__,p_Var10);
    }
    std::__detail::__variant::
    _Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
    ::~_Variant_storage((_Variant_storage<false,_std::variant<wasm::WATParser::AssertReturn,_wasm::WATParser::AssertAction,_wasm::WATParser::AssertModule>,_wasm::None,_wasm::Err>
                         *)&stack0xfffffffffffffd08);
  }
  return __return_storage_ptr__;
code_r0x00c839d3:
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
  ~_Variant_storage(this_00);
  kind.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._32_4_ = local_b8._0_4_;
  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._0_8_ = 5;
  _val_1.val.super__Variant_base<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::NaNKind,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::NaNKind,_wasm::Err>._M_u._16_1_ = 1;
  std::
  vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
  ::emplace_back<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>
            ((vector<std::variant<wasm::Literal,wasm::WATParser::NaNResult>,std::allocator<std::variant<wasm::Literal,wasm::WATParser::NaNResult>>>
              *)auStack_268,(variant<wasm::Literal,_wasm::WATParser::NaNResult> *)this_00);
  std::__detail::__variant::_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Literal,_wasm::WATParser::NaNResult> *)this_00);
  std::__detail::__variant::_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::NaNKind,_wasm::Err> *)local_b8);
  goto LAB_00c83961;
}

Assistant:

MaybeResult<Assertion> assertion(Lexer& in) {
  if (auto a = assertReturn(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertException(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertAction(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertModule(in)) {
    CHECK_ERR(a);
    return Assertion{*a};
  }
  if (auto a = assertTrap(in)) {
    CHECK_ERR(a);
    return *a;
  }
  return {};
}